

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_save.c
# Opt level: O1

void save_objects(FILE *fp,AREA_DATA_conflict *pArea)

{
  bool bVar1;
  OBJ_INDEX_DATA *pObjIndex;
  int iVar2;
  
  fwrite("#OBJS\n",6,1,(FILE *)fp);
  iVar2 = (int)pArea->min_vnum;
  if (pArea->min_vnum <= pArea->max_vnum) {
    do {
      pObjIndex = get_obj_index(0);
      if (pObjIndex != (OBJ_INDEX_DATA *)0x0) {
        save_object(fp,pObjIndex);
      }
      bVar1 = iVar2 < pArea->max_vnum;
      iVar2 = iVar2 + 1;
    } while (bVar1);
  }
  fwrite("#0\n\n\n\n",6,1,(FILE *)fp);
  return;
}

Assistant:

void save_objects(FILE *fp, AREA_DATA *pArea)
{
	OBJ_INDEX_DATA *pObj;

	fprintf(fp, "#OBJS\n");

	for (int i = pArea->min_vnum; i <= pArea->max_vnum; i++)
	{
		if ((pObj = get_obj_index(i)))
			save_object(fp, pObj);
	}

	fprintf(fp, "#0\n\n\n\n");
}